

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colors.cpp
# Opt level: O0

void Colors::outputColorCode(ostream *stream,char *colorCode)

{
  int iVar1;
  anon_class_1_0_00000001 local_19;
  char *local_18;
  char *colorCode_local;
  ostream *stream_local;
  
  local_18 = colorCode;
  colorCode_local = (char *)stream;
  if (outputColorCode(std::ostream&,char_const*)::has_color == '\0') {
    iVar1 = __cxa_guard_acquire(&outputColorCode(std::ostream&,char_const*)::has_color);
    if (iVar1 != 0) {
      outputColorCode::has_color = outputColorCode::anon_class_1_0_00000001::operator()(&local_19);
      __cxa_guard_release(&outputColorCode(std::ostream&,char_const*)::has_color);
    }
  }
  if (((outputColorCode::has_color & 1U) != 0) &&
     ((::(anonymous_namespace)::colors_enabled & 1) != 0)) {
    std::operator<<((ostream *)colorCode_local,local_18);
  }
  return;
}

Assistant:

void Colors::outputColorCode(std::ostream& stream, const char* colorCode) {
  const static bool has_color = []() {
    return (getenv("COLORS") && getenv("COLORS")[0] == '1') || // forced
           (isatty(STDOUT_FILENO) &&
            (!getenv("COLORS") || getenv("COLORS")[0] != '0')); // implicit
  }();
  if (has_color && colors_enabled) {
    stream << colorCode;
  }
}